

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O0

void sample_output<trng::mt19937>(mt19937 *r,string *name)

{
  result_type rVar1;
  ulong uVar2;
  ostream *poVar3;
  string *in_RSI;
  mt19937 *in_RDI;
  int i;
  int local_14;
  
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (0x1f < uVar2) break;
    std::__cxx11::string::operator+=(in_RSI,' ');
  }
  std::operator<<((ostream *)&std::cout,in_RSI);
  for (local_14 = 0; local_14 < 0xf; local_14 = local_14 + 1) {
    rVar1 = trng::mt19937::operator()(in_RDI);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar1);
    std::operator<<(poVar3,'\t');
  }
  rVar1 = trng::mt19937::operator()(in_RDI);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar1);
  std::operator<<(poVar3,'\n');
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}